

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

cs_err cs_open(cs_arch arch,cs_mode mode,csh *handle)

{
  cs_err cVar1;
  cs_struct *pcVar2;
  cs_err cVar3;
  
  cVar3 = CS_ERR_MEMSETUP;
  if ((((cs_mem_malloc != (cs_malloc_t)0x0) && (cs_mem_calloc != (cs_calloc_t)0x0)) &&
      (cs_mem_realloc != (cs_realloc_t)0x0)) &&
     ((cs_mem_free != (cs_free_t)0x0 && (cs_vsnprintf != (cs_vsnprintf_t)0x0)))) {
    archs_enable();
    cVar3 = CS_ERR_ARCH;
    if ((arch < CS_ARCH_MAX) && (arch_init[arch] != (_func_cs_err_cs_struct_ptr *)0x0)) {
      pcVar2 = (cs_struct *)(*cs_mem_calloc)(1,0xb0);
      if (pcVar2 == (cs_struct *)0x0) {
        return CS_ERR_MEM;
      }
      pcVar2->errnum = CS_ERR_OK;
      pcVar2->arch = arch;
      pcVar2->mode = mode;
      pcVar2->big_endian = SUB41((uint)mode >> 0x1f,0);
      pcVar2->detail = CS_OPT_OFF;
      (pcVar2->skipdata_setup).mnemonic = ".byte";
      cVar1 = (*arch_init[arch])(pcVar2);
      cVar3 = CS_ERR_OK;
      if (cVar1 != CS_ERR_OK) {
        (*cs_mem_free)(pcVar2);
        pcVar2 = (cs_struct *)0x0;
        cVar3 = cVar1;
      }
    }
    else {
      pcVar2 = (cs_struct *)0x0;
    }
    *handle = (csh)pcVar2;
  }
  return cVar3;
}

Assistant:

CAPSTONE_API cs_open(cs_arch arch, cs_mode mode, csh *handle)
{
	cs_err err;
	struct cs_struct *ud;
	if (!cs_mem_malloc || !cs_mem_calloc || !cs_mem_realloc || !cs_mem_free || !cs_vsnprintf)
		// Error: before cs_open(), dynamic memory management must be initialized
		// with cs_option(CS_OPT_MEM)
		return CS_ERR_MEMSETUP;

	archs_enable();

	if (arch < CS_ARCH_MAX && arch_init[arch]) {
		ud = cs_mem_calloc(1, sizeof(*ud));
		if (!ud) {
			// memory insufficient
			return CS_ERR_MEM;
		}

		ud->errnum = CS_ERR_OK;
		ud->arch = arch;
		ud->mode = mode;
		ud->big_endian = mode & CS_MODE_BIG_ENDIAN;
		// by default, do not break instruction into details
		ud->detail = CS_OPT_OFF;

		// default skipdata setup
		ud->skipdata_setup.mnemonic = SKIPDATA_MNEM;

		err = arch_init[ud->arch](ud);
		if (err) {
			cs_mem_free(ud);
			*handle = 0;
			return err;
		}

		*handle = (uintptr_t)ud;

		return CS_ERR_OK;
	} else {
		*handle = 0;
		return CS_ERR_ARCH;
	}
}